

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Char * poolStoreString(STRING_POOL *pool,ENCODING *enc,char *ptr,char *end)

{
  int iVar1;
  XML_Char *pXVar2;
  
  pXVar2 = poolAppend(pool,enc,ptr,end);
  if (pXVar2 == (XML_Char *)0x0) {
LAB_0046d75f:
    pXVar2 = (XML_Char *)0x0;
  }
  else {
    pXVar2 = pool->ptr;
    if (pXVar2 == pool->end) {
      iVar1 = poolGrow(pool);
      if (iVar1 == 0) goto LAB_0046d75f;
      pXVar2 = pool->ptr;
    }
    pool->ptr = pXVar2 + 1;
    *pXVar2 = '\0';
    pXVar2 = pool->start;
  }
  return pXVar2;
}

Assistant:

static
XML_Char *poolStoreString(STRING_POOL *pool, const ENCODING *enc,
                          const char *ptr, const char *end)
{
  if (!poolAppend(pool, enc, ptr, end))
    return 0;
  if (pool->ptr == pool->end && !poolGrow(pool))
    return 0;
  *(pool->ptr)++ = 0;
  return pool->start;
}